

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
               (bit_array *x,default_cost_type<long_double> *c,int variables,int value_if_0)

{
  longdouble lVar1;
  int index;
  long lVar2;
  
  if (variables != 0) {
    lVar2 = 0;
    index = 0;
    do {
      lVar1 = *(longdouble *)
               ((long)(c->linear_elements)._M_t.
                      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                      super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar2);
      if (((longdouble)0 < lVar1) || (value_if_0 != 0 && (longdouble)0 == lVar1)) {
        bit_array_impl::set(&x->super_bit_array_impl,index);
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,index);
      }
      index = index + 1;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)variables << 4 != lVar2);
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}